

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O2

Am_Object choice_set_impl_command(Am_Object *inter,Am_Object param_2,Am_Inter_Location param_3)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value *value_00;
  Am_Value *pAVar2;
  Am_Value value;
  
  pAVar2 = &value;
  value_00 = &value;
  inter->data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((Am_Object *)&value,(Am_Slot_Key)param_2.data,0xc6);
  Am_Object::operator=(inter,(Am_Object *)&value);
  Am_Object::~Am_Object((Am_Object *)&value);
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    value.type = 0;
    value.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get((Am_Object *)param_2.data,0x169,1);
    Am_Value::operator=(&value,in_value);
    bVar1 = Am_Value::Exists(&value);
    if (!bVar1) {
      pAVar2 = &Am_No_Value;
    }
    Am_Object::Set(inter,0x169,pAVar2,1);
    Am_Object::Set(inter,0x16d,&value,0);
    pAVar2 = Am_Object::Get((Am_Object *)param_2.data,0x16c,1);
    Am_Value::operator=(&value,pAVar2);
    bVar1 = Am_Value::Exists(&value);
    if (!bVar1) {
      value_00 = &Am_No_Value;
    }
    Am_Object::Set(inter,0x16c,value_00,1);
    Am_Value::~Am_Value(&value);
  }
  return (Am_Object)(Am_Object_Data *)inter;
}

Assistant:

Am_Object
choice_set_impl_command(Am_Object inter, Am_Object /* object_modified */,
                        Am_Inter_Location /* data */)
{
  Am_Object impl_command;
  impl_command = inter.Get_Object(Am_IMPLEMENTATION_COMMAND);
  if (impl_command.Valid()) {

    //set current value into the Am_VALUE slot
    Am_Value value;
    value = inter.Peek(Am_VALUE);
    impl_command.Set(Am_VALUE, value.Exists() ? value : Am_No_Value,
                     Am_OK_IF_NOT_THERE);

    impl_command.Set(Am_OBJECT_MODIFIED, value);

    //set original data into the OLD_VALUE slot
    value = inter.Peek(Am_OLD_VALUE);
    impl_command.Set(Am_OLD_VALUE, value.Exists() ? value : Am_No_Value,
                     Am_OK_IF_NOT_THERE);
  }
  return impl_command;
}